

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint addChunk_sBIT(ucvector *out,LodePNGInfo *info)

{
  uint uVar1;
  uint local_44;
  uint error_3;
  uint error_2;
  uint error_1;
  uint error;
  uchar *chunk;
  LodePNGInfo *pLStack_20;
  uint bitdepth;
  LodePNGInfo *info_local;
  ucvector *out_local;
  
  if ((info->color).colortype == LCT_PALETTE) {
    local_44 = 8;
  }
  else {
    local_44 = (info->color).bitdepth;
  }
  chunk._4_4_ = local_44;
  _error_1 = (uchar *)0x0;
  pLStack_20 = info;
  info_local = (LodePNGInfo *)out;
  if ((info->color).colortype == LCT_GREY) {
    if ((info->sbit_r == 0) || (local_44 < info->sbit_r)) {
      return 0x73;
    }
    uVar1 = lodepng_chunk_init((uchar **)&error_1,out,1,"sBIT");
    if (uVar1 != 0) {
      return uVar1;
    }
    _error_1[8] = (uchar)pLStack_20->sbit_r;
  }
  else if (((info->color).colortype == LCT_RGB) || ((info->color).colortype == LCT_PALETTE)) {
    if ((info->sbit_r == 0) || ((info->sbit_g == 0 || (info->sbit_b == 0)))) {
      return 0x73;
    }
    if (((local_44 < info->sbit_r) || (local_44 < info->sbit_g)) || (local_44 < info->sbit_b)) {
      return 0x73;
    }
    uVar1 = lodepng_chunk_init((uchar **)&error_1,out,3,"sBIT");
    if (uVar1 != 0) {
      return uVar1;
    }
    _error_1[8] = (uchar)pLStack_20->sbit_r;
    _error_1[9] = (uchar)pLStack_20->sbit_g;
    _error_1[10] = (uchar)pLStack_20->sbit_b;
  }
  else if ((info->color).colortype == LCT_GREY_ALPHA) {
    if ((info->sbit_r == 0) || (info->sbit_a == 0)) {
      return 0x73;
    }
    if ((local_44 < info->sbit_r) || (local_44 < info->sbit_a)) {
      return 0x73;
    }
    uVar1 = lodepng_chunk_init((uchar **)&error_1,out,2,"sBIT");
    if (uVar1 != 0) {
      return uVar1;
    }
    _error_1[8] = (uchar)pLStack_20->sbit_r;
    _error_1[9] = (uchar)pLStack_20->sbit_a;
  }
  else if ((info->color).colortype == LCT_RGBA) {
    if (((((info->sbit_r == 0) || (info->sbit_g == 0)) ||
         ((info->sbit_b == 0 || ((info->sbit_a == 0 || (local_44 < info->sbit_r)))))) ||
        (local_44 < info->sbit_g)) || ((local_44 < info->sbit_b || (local_44 < info->sbit_a)))) {
      return 0x73;
    }
    uVar1 = lodepng_chunk_init((uchar **)&error_1,out,4,"sBIT");
    if (uVar1 != 0) {
      return uVar1;
    }
    _error_1[8] = (uchar)pLStack_20->sbit_r;
    _error_1[9] = (uchar)pLStack_20->sbit_g;
    _error_1[10] = (uchar)pLStack_20->sbit_b;
    _error_1[0xb] = (uchar)pLStack_20->sbit_a;
  }
  if (_error_1 != (uchar *)0x0) {
    lodepng_chunk_generate_crc(_error_1);
  }
  return 0;
}

Assistant:

static unsigned addChunk_sBIT(ucvector* out, const LodePNGInfo* info) {
  unsigned bitdepth = (info->color.colortype == LCT_PALETTE) ? 8 : info->color.bitdepth;
  unsigned char* chunk = 0;
  if(info->color.colortype == LCT_GREY) {
    if(info->sbit_r == 0 || info->sbit_r > bitdepth) return 115;
    CERROR_TRY_RETURN(lodepng_chunk_init(&chunk, out, 1, "sBIT"));
    chunk[8] = info->sbit_r;
  } else if(info->color.colortype == LCT_RGB || info->color.colortype == LCT_PALETTE) {
    if(info->sbit_r == 0 || info->sbit_g == 0 || info->sbit_b == 0) return 115;
    if(info->sbit_r > bitdepth || info->sbit_g > bitdepth || info->sbit_b > bitdepth) return 115;
    CERROR_TRY_RETURN(lodepng_chunk_init(&chunk, out, 3, "sBIT"));
    chunk[8] = info->sbit_r;
    chunk[9] = info->sbit_g;
    chunk[10] = info->sbit_b;
  } else if(info->color.colortype == LCT_GREY_ALPHA) {
    if(info->sbit_r == 0 || info->sbit_a == 0) return 115;
    if(info->sbit_r > bitdepth || info->sbit_a > bitdepth) return 115;
    CERROR_TRY_RETURN(lodepng_chunk_init(&chunk, out, 2, "sBIT"));
    chunk[8] = info->sbit_r;
    chunk[9] = info->sbit_a;
  } else if(info->color.colortype == LCT_RGBA) {
    if(info->sbit_r == 0 || info->sbit_g == 0 || info->sbit_b == 0 || info->sbit_a == 0 ||
       info->sbit_r > bitdepth || info->sbit_g > bitdepth ||
       info->sbit_b > bitdepth || info->sbit_a > bitdepth) {
      return 115;
    }
    CERROR_TRY_RETURN(lodepng_chunk_init(&chunk, out, 4, "sBIT"));
    chunk[8] = info->sbit_r;
    chunk[9] = info->sbit_g;
    chunk[10] = info->sbit_b;
    chunk[11] = info->sbit_a;
  }
  if(chunk) lodepng_chunk_generate_crc(chunk);
  return 0;
}